

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

PMJ02BNSampler *
pbrt::PMJ02BNSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  int samplesPerPixel;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"pixelsamples","");
  iVar1 = ParameterDictionary::GetOneInt(parameters,&local_48,0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(char *)(Options + 0x1c) == '\x01') {
    iVar1 = *(int *)(Options + 0x18);
  }
  samplesPerPixel = 1;
  if (*(char *)(Options + 8) == '\0') {
    samplesPerPixel = iVar1;
  }
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  PMJ02BNSampler((PMJ02BNSampler *)CONCAT44(extraout_var,iVar1),samplesPerPixel,alloc);
  return (PMJ02BNSampler *)CONCAT44(extraout_var,iVar1);
}

Assistant:

PMJ02BNSampler *PMJ02BNSampler::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    return alloc.new_object<PMJ02BNSampler>(nsamp, alloc);
}